

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block.c
# Opt level: O2

void aom_cdef_find_dir(uint16_t *in,cdef_list *dlist,int (*var) [16],int cdef_count,int coeff_shift,
                      int (*dir) [16])

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  long lVar6;
  
  for (lVar6 = 0; lVar6 < cdef_count + -1; lVar6 = lVar6 + 2) {
    bVar1 = dlist[lVar6].by;
    bVar2 = dlist[lVar6].bx;
    bVar3 = dlist[lVar6 + 1].by;
    bVar4 = dlist[lVar6 + 1].bx;
    (*cdef_find_dir_dual)
              (in + (ulong)bVar2 * 8 + (ulong)bVar1 * 0x480,
               in + (ulong)bVar4 * 8 + (ulong)bVar3 * 0x480,0x90,var[bVar1] + bVar2,
               var[bVar3] + bVar4,coeff_shift,dir[bVar1] + bVar2,dir[bVar3] + bVar4);
  }
  if ((cdef_count & 1U) != 0) {
    bVar1 = dlist[lVar6].by;
    bVar2 = dlist[lVar6].bx;
    iVar5 = (*cdef_find_dir)(in + (ulong)bVar2 * 8 + (ulong)bVar1 * 0x480,0x90,var[bVar1] + bVar2,
                             coeff_shift);
    dir[bVar1][bVar2] = iVar5;
  }
  return;
}

Assistant:

static inline void aom_cdef_find_dir(const uint16_t *in, cdef_list *dlist,
                                     int var[CDEF_NBLOCKS][CDEF_NBLOCKS],
                                     int cdef_count, int coeff_shift,
                                     int dir[CDEF_NBLOCKS][CDEF_NBLOCKS]) {
  int bi;

  // Find direction of two 8x8 blocks together.
  for (bi = 0; bi < cdef_count - 1; bi += 2) {
    const int by = dlist[bi].by;
    const int bx = dlist[bi].bx;
    const int by2 = dlist[bi + 1].by;
    const int bx2 = dlist[bi + 1].bx;
    const int pos1 = 8 * by * CDEF_BSTRIDE + 8 * bx;
    const int pos2 = 8 * by2 * CDEF_BSTRIDE + 8 * bx2;
    cdef_find_dir_dual(&in[pos1], &in[pos2], CDEF_BSTRIDE, &var[by][bx],
                       &var[by2][bx2], coeff_shift, &dir[by][bx],
                       &dir[by2][bx2]);
  }

  // Process remaining 8x8 blocks here. One 8x8 at a time.
  if (cdef_count % 2) {
    const int by = dlist[bi].by;
    const int bx = dlist[bi].bx;
    dir[by][bx] = cdef_find_dir(&in[8 * by * CDEF_BSTRIDE + 8 * bx],
                                CDEF_BSTRIDE, &var[by][bx], coeff_shift);
  }
}